

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveModel(FastText *this,string *filename)

{
  byte bVar1;
  invalid_argument *this_00;
  element_type *peVar2;
  string *in_RSI;
  ostream *in_RDI;
  ofstream ofs;
  ostream *in_stack_fffffffffffffd98;
  Args *in_stack_fffffffffffffda0;
  QMatrix *this_01;
  char *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  char local_210 [72];
  ostream *in_stack_fffffffffffffe38;
  Dictionary *in_stack_fffffffffffffe40;
  
  this_01 = (QMatrix *)local_210;
  std::ofstream::ofstream(this_01,in_RSI,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::invalid_argument::invalid_argument(this_00,(string *)&stack0xfffffffffffffdc0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  signModel((FastText *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17441e);
  Args::save(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17443b);
  Dictionary::save(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::ostream::write(local_210,(long)(in_RDI + 0x98));
  if (((byte)in_RDI[0x98] & 1) == 0) {
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1744a2);
    Matrix::save((Matrix *)this_01,in_RDI);
  }
  else {
    std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x174483);
    QMatrix::save(this_01,in_RDI);
  }
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1744bd);
  std::ostream::write(local_210,(long)&peVar2->qout);
  if (((byte)in_RDI[0x98] & 1) != 0) {
    peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1744f0);
    if ((peVar2->qout & 1U) != 0) {
      std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x174507);
      QMatrix::save(this_01,in_RDI);
      goto LAB_00174537;
    }
  }
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x174526);
  Matrix::save((Matrix *)this_01,in_RDI);
LAB_00174537:
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void FastText::saveModel(const std::string& filename) {
	std::ofstream ofs(filename, std::ofstream::binary);
	if (!ofs.is_open()) {
		throw std::invalid_argument(filename + " cannot be opened for saving!");
	}
	signModel(ofs);
	args_->save(ofs);
	dict_->save(ofs);

	ofs.write((char*)&(quant_), sizeof(bool));
	if (quant_) {
		qinput_->save(ofs);
	} else {
		input_->save(ofs);
	}

	ofs.write((char*)&(args_->qout), sizeof(bool));
	if (quant_ && args_->qout) {
		qoutput_->save(ofs);
	} else {
		output_->save(ofs);
	}

	ofs.close();
}